

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydataops.h
# Opt level: O3

void __thiscall
QtPrivate::QGenericArrayOps<QCss::StyleSheet>::copyAppend
          (QGenericArrayOps<QCss::StyleSheet> *this,StyleSheet *b,StyleSheet *e)

{
  StyleSheet *pSVar1;
  Data *pDVar2;
  Data *pDVar3;
  Data *pDVar4;
  Data *pDVar5;
  Data *pDVar6;
  Data *pDVar7;
  int iVar8;
  long lVar9;
  
  if ((b != e) && (b < e)) {
    pSVar1 = (this->super_QArrayDataPointer<QCss::StyleSheet>).ptr;
    lVar9 = (this->super_QArrayDataPointer<QCss::StyleSheet>).size;
    do {
      pDVar2 = (b->styleRules).d.d;
      pSVar1[lVar9].styleRules.d.d = pDVar2;
      pSVar1[lVar9].styleRules.d.ptr = (b->styleRules).d.ptr;
      pSVar1[lVar9].styleRules.d.size = (b->styleRules).d.size;
      if (pDVar2 != (Data *)0x0) {
        LOCK();
        (pDVar2->super_QArrayData).ref_._q_value.super___atomic_base<int> =
             (__atomic_base<int>)
             ((__int_type)(pDVar2->super_QArrayData).ref_._q_value.super___atomic_base<int> + 1);
        UNLOCK();
      }
      pDVar3 = (b->mediaRules).d.d;
      pSVar1[lVar9].mediaRules.d.d = pDVar3;
      pSVar1[lVar9].mediaRules.d.ptr = (b->mediaRules).d.ptr;
      pSVar1[lVar9].mediaRules.d.size = (b->mediaRules).d.size;
      if (pDVar3 != (Data *)0x0) {
        LOCK();
        (pDVar3->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             (pDVar3->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
        UNLOCK();
      }
      pDVar4 = (b->pageRules).d.d;
      pSVar1[lVar9].pageRules.d.d = pDVar4;
      pSVar1[lVar9].pageRules.d.ptr = (b->pageRules).d.ptr;
      pSVar1[lVar9].pageRules.d.size = (b->pageRules).d.size;
      if (pDVar4 != (Data *)0x0) {
        LOCK();
        (pDVar4->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             (pDVar4->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
        UNLOCK();
      }
      pDVar5 = (b->animationRules).d.d;
      pSVar1[lVar9].animationRules.d.d = pDVar5;
      pSVar1[lVar9].animationRules.d.ptr = (b->animationRules).d.ptr;
      pSVar1[lVar9].animationRules.d.size = (b->animationRules).d.size;
      if (pDVar5 != (Data *)0x0) {
        LOCK();
        (pDVar5->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             (pDVar5->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
        UNLOCK();
      }
      pDVar6 = (b->importRules).d.d;
      pSVar1[lVar9].importRules.d.d = pDVar6;
      pSVar1[lVar9].importRules.d.ptr = (b->importRules).d.ptr;
      pSVar1[lVar9].importRules.d.size = (b->importRules).d.size;
      if (pDVar6 != (Data *)0x0) {
        LOCK();
        (pDVar6->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             (pDVar6->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
        UNLOCK();
      }
      iVar8 = b->depth;
      pSVar1[lVar9].origin = b->origin;
      pSVar1[lVar9].depth = iVar8;
      pDVar7 = (b->nameIndex).d;
      pSVar1[lVar9].nameIndex.d = pDVar7;
      pSVar1[lVar9].nameIndex.m_size = (b->nameIndex).m_size;
      if ((pDVar7 != (Data *)0x0) && (*(int *)pDVar7 != -1)) {
        LOCK();
        *(int *)pDVar7 = *(int *)pDVar7 + 1;
        UNLOCK();
      }
      pDVar7 = (b->idIndex).d;
      pSVar1[lVar9].idIndex.d = pDVar7;
      pSVar1[lVar9].idIndex.m_size = (b->idIndex).m_size;
      if ((pDVar7 != (Data *)0x0) && (*(int *)pDVar7 != -1)) {
        LOCK();
        *(int *)pDVar7 = *(int *)pDVar7 + 1;
        UNLOCK();
      }
      b = b + 1;
      lVar9 = (this->super_QArrayDataPointer<QCss::StyleSheet>).size + 1;
      (this->super_QArrayDataPointer<QCss::StyleSheet>).size = lVar9;
    } while (b < e);
  }
  return;
}

Assistant:

void copyAppend(const T *b, const T *e)
    {
        Q_ASSERT(this->isMutable() || b == e);
        Q_ASSERT(!this->isShared() || b == e);
        Q_ASSERT(b <= e);
        Q_ASSERT((e - b) <= this->freeSpaceAtEnd());

        if (b == e) // short-cut and handling the case b and e == nullptr
            return;

        T *data = this->begin();
        while (b < e) {
            new (data + this->size) T(*b);
            ++b;
            ++this->size;
        }
    }